

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fio_ls_embd_s * fio_ls_embd_remove(fio_ls_embd_s *node)

{
  fio_ls_embd_s *pfVar1;
  fio_ls_embd_s *pfVar2;
  
  pfVar1 = node->next;
  if (pfVar1 == node || pfVar1 == (fio_ls_embd_s *)0x0) {
    return (fio_ls_embd_s *)0x0;
  }
  pfVar2 = node->prev;
  pfVar1->prev = pfVar2;
  pfVar2->next = pfVar1;
  node->next = node;
  node->prev = node;
  return node;
}

Assistant:

FIO_FUNC inline fio_ls_embd_s *fio_ls_embd_remove(fio_ls_embd_s *node) {
  if (!node->next || node->next == node) {
    /* never remove the list's head */
    return NULL;
  }
  node->next->prev = node->prev;
  node->prev->next = node->next;
  node->prev = node->next = node;
  return node;
}